

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O0

bool absl::lts_20250127::time_internal::cctz::time_zone::Impl::LoadTimeZone
               (string *name,time_zone *tz)

{
  bool bVar1;
  mutex *pmVar2;
  pointer pvVar3;
  Impl *this;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
  *this_00;
  pointer pIVar4;
  mapped_type local_d8;
  bool local_a1;
  time_zone local_a0;
  mapped_type *local_98;
  Impl **impl;
  lock_guard<std::mutex> lock;
  unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
  new_impl;
  time_zone local_78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
  local_70 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
  local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
  local_50;
  const_iterator itr;
  lock_guard<std::mutex> lock_1;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  seconds local_30;
  duration<long,_std::ratio<1L,_1L>_> offset;
  Impl *utc_impl;
  time_zone *tz_local;
  string *name_local;
  
  offset.__r = (rep)UTCImpl();
  memset(&local_30,0,8);
  bVar1 = FixedOffsetFromName(name,&local_30);
  local_a1 = false;
  if (bVar1) {
    local_38 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
    local_a1 = std::chrono::operator==(&local_30,&local_38);
  }
  if (local_a1 != false) {
    time_zone((time_zone *)&lock_1,(Impl *)offset.__r);
    tz->impl_ = (Impl *)lock_1._M_device;
    name_local._7_1_ = 1;
    goto LAB_00541e75;
  }
  pmVar2 = anon_unknown_7::TimeZoneMutex();
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,pmVar2);
  if ((anonymous_namespace)::time_zone_map_abi_cxx11_ ==
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
       *)0x0) {
LAB_00541c97:
    bVar1 = false;
  }
  else {
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
         ::find((anonymous_namespace)::time_zone_map_abi_cxx11_,name);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
    ::_Node_const_iterator
              ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
                *)&local_50,
               (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
                *)&local_58);
    local_70[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
         ::end((anonymous_namespace)::time_zone_map_abi_cxx11_);
    bVar1 = std::__detail::operator!=(&local_50,local_70);
    if (!bVar1) goto LAB_00541c97;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
                           *)&local_50);
    time_zone(&local_78,pvVar3->second);
    tz->impl_ = (Impl *)local_78;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_false,_true>
                           *)&local_50);
    name_local._7_1_ = pvVar3->second != (Impl *)offset.__r;
    bVar1 = true;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  if (!bVar1) {
    this = (Impl *)operator_new(0x28);
    Impl(this,name);
    std::
    unique_ptr<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const,std::default_delete<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const>>
    ::
    unique_ptr<std::default_delete<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const>,void>
              ((unique_ptr<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const,std::default_delete<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const>>
                *)&lock,this);
    pmVar2 = anon_unknown_7::TimeZoneMutex();
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&impl,pmVar2);
    if ((anonymous_namespace)::time_zone_map_abi_cxx11_ ==
        (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
         *)0x0) {
      this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
                 *)operator_new(0x38);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
      ::unordered_map(this_00);
      (anonymous_namespace)::time_zone_map_abi_cxx11_ = this_00;
    }
    local_98 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>_>
               ::operator[]((anonymous_namespace)::time_zone_map_abi_cxx11_,name);
    if (*local_98 == (mapped_type)0x0) {
      pIVar4 = std::
               unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
               ::operator->((unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
                             *)&lock);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pIVar4->zone_);
      if (bVar1) {
        local_d8 = std::
                   unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
                   ::release((unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
                              *)&lock);
      }
      else {
        local_d8 = (mapped_type)offset.__r;
      }
      *local_98 = local_d8;
    }
    time_zone(&local_a0,*local_98);
    tz->impl_ = (Impl *)local_a0;
    name_local._7_1_ = *local_98 != (mapped_type)offset.__r;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&impl);
    std::
    unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
    ::~unique_ptr((unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
                   *)&lock);
  }
LAB_00541e75:
  return (bool)(name_local._7_1_ & 1);
}

Assistant:

bool time_zone::Impl::LoadTimeZone(const std::string& name, time_zone* tz) {
  const Impl* const utc_impl = UTCImpl();

  // Check for UTC (which is never a key in time_zone_map).
  auto offset = seconds::zero();
  if (FixedOffsetFromName(name, &offset) && offset == seconds::zero()) {
    *tz = time_zone(utc_impl);
    return true;
  }

  // Check whether the time zone has already been loaded.
  {
    std::lock_guard<std::mutex> lock(TimeZoneMutex());
    if (time_zone_map != nullptr) {
      TimeZoneImplByName::const_iterator itr = time_zone_map->find(name);
      if (itr != time_zone_map->end()) {
        *tz = time_zone(itr->second);
        return itr->second != utc_impl;
      }
    }
  }

  // Load the new time zone (outside the lock).
  std::unique_ptr<const Impl> new_impl(new Impl(name));

  // Add the new time zone to the map.
  std::lock_guard<std::mutex> lock(TimeZoneMutex());
  if (time_zone_map == nullptr) time_zone_map = new TimeZoneImplByName;
  const Impl*& impl = (*time_zone_map)[name];
  if (impl == nullptr) {  // this thread won any load race
    impl = new_impl->zone_ ? new_impl.release() : utc_impl;
  }
  *tz = time_zone(impl);
  return impl != utc_impl;
}